

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * getLinkedTargetsContent<cmLinkItem>
                   (string *__return_storage_ptr__,
                   vector<cmLinkItem,_std::allocator<cmLinkItem>_> *libraries,
                   cmGeneratorTarget *target,cmGeneratorTarget *headTarget,
                   cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagChecker
                   ,string *interfacePropertyName)

{
  pointer pcVar1;
  string *input;
  cmGlobalGenerator *this;
  undefined8 *puVar2;
  long *plVar3;
  cmLocalGenerator *lg;
  long *plVar4;
  pointer pcVar5;
  ulong uVar6;
  undefined8 uVar7;
  string uniqueName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string sep;
  string depString;
  string local_158;
  long *local_138;
  undefined8 local_130;
  long local_128;
  undefined8 uStack_120;
  string *local_118;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90;
  char *local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  cmGeneratorExpressionDAGChecker *local_48;
  cmGeneratorExpressionContext *local_40;
  cmGeneratorTarget *local_38;
  
  local_50 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_90 = &local_80;
  local_88 = (char *)0x0;
  local_80 = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  pcVar5 = (libraries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (libraries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_118 = __return_storage_ptr__;
  local_48 = dagChecker;
  local_40 = context;
  local_38 = headTarget;
  if (pcVar5 != pcVar1) {
    do {
      if (pcVar5->Target != target && pcVar5->Target != (cmGeneratorTarget *)0x0) {
        this = cmGeneratorTarget::GetGlobalGenerator(target);
        cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_(&local_158,this,pcVar5->Target);
        local_110 = local_100;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,local_90,local_88 + (long)local_90);
        std::__cxx11::string::append((char *)&local_110);
        uVar6 = 0xf;
        if (local_110 != local_100) {
          uVar6 = local_100[0];
        }
        if (uVar6 < local_158._M_string_length + local_108) {
          uVar7 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            uVar7 = local_158.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar7 < local_158._M_string_length + local_108) goto LAB_003c43a6;
          puVar2 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_110);
        }
        else {
LAB_003c43a6:
          puVar2 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_110,(ulong)local_158._M_dataplus._M_p);
        }
        local_138 = &local_128;
        plVar3 = puVar2 + 2;
        if ((long *)*puVar2 == plVar3) {
          local_128 = *plVar3;
          uStack_120 = puVar2[3];
        }
        else {
          local_128 = *plVar3;
          local_138 = (long *)*puVar2;
        }
        local_130 = puVar2[1];
        *puVar2 = plVar3;
        puVar2[1] = 0;
        *(undefined1 *)plVar3 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_f0 = &local_e0;
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_e0 = *plVar4;
          lStack_d8 = plVar3[3];
        }
        else {
          local_e0 = *plVar4;
          local_f0 = (long *)*plVar3;
        }
        local_e8 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_f0,
                                    (ulong)(interfacePropertyName->_M_dataplus)._M_p);
        local_d0 = &local_c0;
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_c0 = *plVar4;
          lStack_b8 = plVar3[3];
        }
        else {
          local_c0 = *plVar4;
          local_d0 = (long *)*plVar3;
        }
        local_c8 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_a0 = *plVar4;
          lStack_98 = plVar3[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar4;
          local_b0 = (long *)*plVar3;
        }
        local_a8 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,local_128 + 1);
        }
        if (local_110 != local_100) {
          operator_delete(local_110,local_100[0] + 1);
        }
        std::__cxx11::string::_M_replace((ulong)&local_90,0,local_88,0x5221e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != pcVar1);
  }
  input = local_118;
  if (local_70._M_string_length != 0) {
    lg = cmGeneratorTarget::GetLocalGenerator(target);
    cmGeneratorExpressionNode::EvaluateDependentExpression
              (&local_158,&local_70,lg,local_40,local_38,target,local_48);
    std::__cxx11::string::operator=((string *)input,(string *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
  }
  cmGeneratorExpression::StripEmptyListElements(&local_158,input);
  std::__cxx11::string::operator=((string *)input,(string *)&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return input;
}

Assistant:

std::string getLinkedTargetsContent(
  std::vector<T> const& libraries, cmGeneratorTarget const* target,
  cmGeneratorTarget const* headTarget, cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  const std::string& interfacePropertyName)
{
  std::string linkedTargetsContent;
  std::string sep;
  std::string depString;
  for (T const& l : libraries) {
    // Broken code can have a target in its own link interface.
    // Don't follow such link interface entries so as not to create a
    // self-referencing loop.
    if (l.Target && l.Target != target) {
      std::string uniqueName =
        target->GetGlobalGenerator()->IndexGeneratorTargetUniquely(l.Target);
      depString += sep + "$<TARGET_PROPERTY:" + std::move(uniqueName) + "," +
        interfacePropertyName + ">";
      sep = ";";
    }
  }
  if (!depString.empty()) {
    linkedTargetsContent =
      cmGeneratorExpressionNode::EvaluateDependentExpression(
        depString, target->GetLocalGenerator(), context, headTarget, target,
        dagChecker);
  }
  linkedTargetsContent =
    cmGeneratorExpression::StripEmptyListElements(linkedTargetsContent);
  return linkedTargetsContent;
}